

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::PortSymbol::fromSyntax
          (PortSymbol *this,PortListSyntax *syntax,Scope *scope,
          SmallVectorBase<const_slang::ast::Symbol_*> *results,
          SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
          *implicitMembers,
          span<const_std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
          portDeclarations)

{
  Symbol **ppSVar1;
  DotMemberClauseSyntax **this_00;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *psVar2;
  SyntaxKind SVar3;
  SymbolKind SVar4;
  Type *pTVar5;
  InterfacePortHeaderSyntax *header;
  int *piVar6;
  pointer ppVar7;
  Symbol *pSVar8;
  Symbol *pSVar9;
  Symbol *pSVar10;
  PortConcatenationSyntax *pPVar11;
  uint uVar12;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>
  unpackedDimensions;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  byte bVar16;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs_01;
  string_view modport;
  undefined1 auVar17 [16];
  string_view sVar18;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs_02;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs_03;
  size_t sVar19;
  Compilation *pCVar20;
  Scope *pSVar21;
  group_type_pointer pgVar22;
  ParentList *pPVar23;
  size_t sVar24;
  bool bVar25;
  byte bVar26;
  ArgumentDirection AVar27;
  uint uVar28;
  MemberSyntax *pMVar29;
  PortSymbol *this_01;
  NetType *pNVar30;
  Symbol *pSVar31;
  SourceLocation SVar32;
  Diagnostic *pDVar33;
  ImplicitTypeSyntax *type;
  DeclaratorSyntax *pDVar34;
  uint64_t uVar35;
  NetSymbol *pNVar36;
  Symbol *pSVar37;
  SyntaxNode *pSVar38;
  char *pcVar39;
  group_type_pointer pgVar40;
  SymbolIndex SVar41;
  DataTypeSyntax *pDVar42;
  Symbol **ppSVar43;
  __extent_storage<18446744073709551615UL> iface;
  ulong uVar44;
  DefinitionSymbol *pDVar45;
  long lVar46;
  ulong uVar47;
  bitmask<slang::ast::LookupFlags> bVar48;
  SourceLocation *args;
  basic_string_view<char,_std::char_traits<char>_> *args_1;
  PortInfo *in_R9;
  PortInfo *args_2;
  NetPortHeaderSyntax *netHeader;
  type *name_4;
  ulong uVar49;
  value_type_pointer ppVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  string_view name;
  string_view sVar54;
  SourceRange SVar55;
  string_view sVar56;
  PortInfo *in_stack_fffffffffffffb58;
  ParentList *pPVar57;
  pointer ppAVar58;
  __extent_storage<18446744073709551615UL> _Var59;
  DataDeclarationSyntax *data;
  const_iterator __begin5;
  SourceLocation declLoc;
  char *local_470;
  string_view name_1;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
  *local_458;
  const_iterator __begin3;
  string_view name_3;
  __extent_storage<18446744073709551615UL> local_410;
  AnsiPortListBuilder builder;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
  local_70;
  
  builder.scope = (Scope *)syntax;
  builder.implicitMembers =
       (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)results;
  if ((this->super_Symbol).kind == AssociativeArrayType) {
    builder.comp = *(Compilation **)&syntax->super_SyntaxNode;
    builder.lastDirection = InOut;
    builder.lastType = (DataTypeSyntax *)0x0;
    builder.lastNetType = (NetType *)0x0;
    builder.lastInterface = (DefinitionSymbol *)0x0;
    builder.lastModport._M_len._0_1_ = 0;
    ppSVar1 = &(this->super_Symbol).nextInScope;
    __begin3.index = 0;
    builder.lastModport._M_len._1_7_ = 0;
    builder.lastModport._M_str = (char *)0x0;
    builder.lastGenericIface = false;
    pTVar5 = this->type;
    pNVar30 = (NetType *)implicitMembers;
    __begin3.list = (ParentList *)ppSVar1;
    for (; (__begin3.list != (ParentList *)ppSVar1 ||
           (__begin3.index != (ulong)((long)&(pTVar5->super_Symbol).kind + 1U) >> 1));
        __begin3.index = __begin3.index + 1) {
      pMVar29 = slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::
                iterator_base<const_slang::syntax::MemberSyntax_*>::dereference(&__begin3);
      pCVar20 = builder.comp;
      bVar48.m_bits = (underlying_type)pNVar30;
      if ((pMVar29->super_SyntaxNode).kind == ImplicitAnsiPort) {
        header = *(InterfacePortHeaderSyntax **)&pMVar29[1].super_SyntaxNode;
        pDVar34 = (DeclaratorSyntax *)pMVar29[1].super_SyntaxNode.parent;
        SVar3 = (header->super_PortHeaderSyntax).super_SyntaxNode.kind;
        if (SVar3 == InterfacePortHeader) {
          if ((header->nameOrKeyword).kind == InterfaceKeyword) {
            if (header->modport == (DotMemberClauseSyntax *)0x0) {
              sVar54 = (string_view)ZEXT816(0);
            }
            else {
              sVar54 = parsing::Token::valueText(&header->modport->member);
            }
            psVar2 = &(pMVar29->attributes).
                      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>;
            ppAVar58 = psVar2->_M_ptr;
            _Var59._M_extent_value =
                 (pMVar29->attributes).
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                 _M_extent._M_extent_value;
            name_3._M_len = (size_t)psVar2->_M_ptr;
            name_3._M_str = *(char **)&psVar2->_M_extent;
            bVar25 = true;
            iface._M_extent_value = (size_t)(DefinitionSymbol *)0x0;
          }
          else {
            anon_unknown_0::getInterfacePortInfo
                      ((tuple<const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
                        *)&name_3,builder.scope,header);
            psVar2 = &(pMVar29->attributes).
                      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>;
            ppAVar58 = psVar2->_M_ptr;
            _Var59._M_extent_value =
                 (pMVar29->attributes).
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                 _M_extent._M_extent_value;
            name_1._M_len = (size_t)psVar2->_M_ptr;
            name_1._M_str = *(char **)&psVar2->_M_extent;
            bVar25 = false;
            iface._M_extent_value = local_410._M_extent_value;
            sVar54 = name_3;
          }
          pNVar30 = (NetType *)sVar54._M_str;
          attrs_00._M_extent._M_extent_value = _Var59._M_extent_value;
          attrs_00._M_ptr = ppAVar58;
          pSVar31 = anon_unknown_0::AnsiPortListBuilder::add
                              (&builder,pDVar34,(DefinitionSymbol *)iface._M_extent_value,sVar54,
                               bVar25,attrs_00);
        }
        else {
          AVar27 = builder.lastDirection;
          if (SVar3 == NetPortHeader) {
            if ((header->nameOrKeyword).info != (Info *)0x0) {
              AVar27 = SemanticFacts::getDirection((header->nameOrKeyword).kind);
            }
            type = (ImplicitTypeSyntax *)header[1].super_PortHeaderSyntax.super_SyntaxNode.parent;
            pNVar30 = Compilation::getNetType(builder.comp,*(TokenKind *)&header->modport);
            psVar2 = &(pMVar29->attributes).
                      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>;
            pPVar57 = (ParentList *)psVar2->_M_ptr;
            _Var59._M_extent_value =
                 (pMVar29->attributes).
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                 _M_extent._M_extent_value;
            name_3._M_len = (size_t)psVar2->_M_ptr;
            name_3._M_str = *(char **)&psVar2->_M_extent;
            pPVar23 = __begin5.list;
            sVar24 = __begin5.index;
          }
          else {
            if ((((*(long *)&header[1].super_PortHeaderSyntax.super_SyntaxNode != 0) ||
                 (header[1].super_PortHeaderSyntax.super_SyntaxNode.previewNode != (SyntaxNode *)0x0
                 )) || (piVar6 = *(int **)&header[1].nameOrKeyword, *piVar6 != 0xf7)) ||
               ((*(long *)(piVar6 + 8) != 0 || (*(long *)(piVar6 + 0x16) != 0)))) {
              this_00 = &header->modport;
              sVar54 = slang::syntax::SyntaxFacts::getSimpleTypeName
                                 (*(DataTypeSyntax **)&header[1].nameOrKeyword);
              name._M_len = sVar54._M_str;
              if ((Scope *)sVar54._M_len == (Scope *)0x0) {
LAB_0068e40b:
                AVar27 = builder.lastDirection;
                if (*(long *)&header[1].super_PortHeaderSyntax.super_SyntaxNode != 0) {
                  AVar27 = SemanticFacts::getDirection(*(TokenKind *)this_00);
                }
                pSVar21 = builder.scope;
                if (header[1].super_PortHeaderSyntax.super_SyntaxNode.previewNode ==
                    (SyntaxNode *)0x0) {
                  if ((AVar27 == InOut) ||
                     ((AVar27 != Ref && (**(int **)&header[1].nameOrKeyword == 0xf7)))) {
                    SVar32 = parsing::Token::location(&pDVar34->name);
                    pNVar30 = anon_unknown_0::getDefaultNetType(pSVar21,SVar32);
                  }
                  else {
                    pNVar30 = (NetType *)0x0;
                  }
                }
                else {
                  pNVar30 = (NetType *)0x0;
                }
                pDVar42 = *(DataTypeSyntax **)&header[1].nameOrKeyword;
                psVar2 = &(pMVar29->attributes).
                          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
                ;
                ppAVar58 = psVar2->_M_ptr;
                _Var59._M_extent_value =
                     (pMVar29->attributes).
                     super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                     _M_extent._M_extent_value;
                name_3._M_len = (size_t)psVar2->_M_ptr;
                name_3._M_str = *(char **)&psVar2->_M_extent;
              }
              else {
                name._M_str = (char *)0x1;
                pNVar30 = (NetType *)
                          Lookup::unqualified((Lookup *)builder.scope,(Scope *)sVar54._M_len,name,
                                              bVar48);
                if (pNVar30 == (NetType *)0x0) {
LAB_0068e36a:
                  Compilation::tryGetDefinition
                            ((DefinitionLookupResult *)&name_3,builder.comp,sVar54,builder.scope);
                  pSVar21 = builder.scope;
                  pDVar45 = (DefinitionSymbol *)name_3._M_len;
                  if ((name_3._M_len != 0) && (*(int *)name_3._M_len == 2)) {
                    if (*(int *)(name_3._M_len + 0x48) == 1) {
                      if (header[1].super_PortHeaderSyntax.super_SyntaxNode.previewNode !=
                          (SyntaxNode *)0x0) {
                        SVar32 = parsing::Token::location
                                           ((Token *)&header[1].super_PortHeaderSyntax.
                                                      super_SyntaxNode.parent);
                        Scope::addDiag(pSVar21,(DiagCode)0xd80006,SVar32);
                      }
                      pSVar21 = builder.scope;
                      if (*(long *)&header[1].super_PortHeaderSyntax.super_SyntaxNode != 0) {
                        SVar32 = parsing::Token::location((Token *)this_00);
                        Scope::addDiag(pSVar21,(DiagCode)0x2e0006,SVar32);
                      }
                    }
                    else {
                      SVar55 = slang::syntax::SyntaxNode::sourceRange
                                         (*(SyntaxNode **)&header[1].nameOrKeyword);
                      pDVar33 = Scope::addDiag(pSVar21,(DiagCode)0xa10006,SVar55);
                      Diagnostic::operator<<(pDVar33,*(string_view *)((long)pDVar45 + 8));
                      Diagnostic::addNote(pDVar33,(DiagCode)0x50001,
                                          *(SourceLocation *)((long)pDVar45 + 0x18));
                      pDVar45 = (DefinitionSymbol *)0x0;
                    }
                    psVar2 = &(pMVar29->attributes).
                              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
                    ;
                    attrs_02._M_ptr = psVar2->_M_ptr;
                    attrs_02._M_extent._M_extent_value = (psVar2->_M_extent)._M_extent_value;
                    name_3._M_len = (size_t)psVar2->_M_ptr;
                    name_3._M_str = *(char **)&psVar2->_M_extent;
                    pNVar30 = (NetType *)0x88e35c;
                    pSVar31 = anon_unknown_0::AnsiPortListBuilder::add
                                        (&builder,pDVar34,pDVar45,
                                         (string_view)(ZEXT816(0x88e35c) << 0x40),false,attrs_02);
                    goto LAB_0068e531;
                  }
                  goto LAB_0068e40b;
                }
                if ((pNVar30->super_Symbol).kind != NetType) {
                  bVar25 = Symbol::isType((Symbol *)pNVar30);
                  if (bVar25) goto LAB_0068e40b;
                  goto LAB_0068e36a;
                }
                AVar27 = builder.lastDirection;
                if (*(long *)&header[1].super_PortHeaderSyntax.super_SyntaxNode != 0) {
                  AVar27 = SemanticFacts::getDirection(*(TokenKind *)this_00);
                }
                psVar2 = &(pMVar29->attributes).
                          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
                ;
                ppAVar58 = psVar2->_M_ptr;
                _Var59._M_extent_value =
                     (pMVar29->attributes).
                     super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                     _M_extent._M_extent_value;
                name_3._M_len = (size_t)psVar2->_M_ptr;
                name_3._M_str = *(char **)&psVar2->_M_extent;
                pDVar42 = (DataTypeSyntax *)0x0;
              }
              attrs_01._M_extent._M_extent_value = _Var59._M_extent_value;
              attrs_01._M_ptr = ppAVar58;
              pSVar31 = anon_unknown_0::AnsiPortListBuilder::add
                                  (&builder,pDVar34,AVar27,pDVar42,pNVar30,attrs_01);
              goto LAB_0068e531;
            }
            psVar2 = &(pMVar29->attributes).
                      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>;
            pPVar57 = (ParentList *)psVar2->_M_ptr;
            _Var59._M_extent_value =
                 (pMVar29->attributes).
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                 _M_extent._M_extent_value;
            attrs_03._M_ptr = psVar2->_M_ptr;
            attrs_03._M_extent._M_extent_value = (psVar2->_M_extent)._M_extent_value;
            sVar18._M_len = (size_t)psVar2->_M_ptr;
            sVar18._M_str = *(char **)&psVar2->_M_extent;
            if (builder.lastInterface != (DefinitionSymbol *)0x0 ||
                (builder.lastGenericIface & 1U) != 0) {
              modport._M_len._1_7_ = builder.lastModport._M_len._1_7_;
              modport._M_len._0_1_ = (undefined1)builder.lastModport._M_len;
              modport._M_str = builder.lastModport._M_str;
              pNVar30 = (NetType *)builder.lastModport._M_str;
              name_3 = sVar18;
              pSVar31 = anon_unknown_0::AnsiPortListBuilder::add
                                  (&builder,pDVar34,builder.lastInterface,modport,
                                   (bool)(builder.lastInterface == (DefinitionSymbol *)0x0 |
                                         builder.lastGenericIface & 1U),attrs_03);
              goto LAB_0068e531;
            }
            pNVar30 = builder.lastNetType;
            type = (ImplicitTypeSyntax *)builder.lastType;
            pPVar23 = pPVar57;
            sVar24 = _Var59._M_extent_value;
            if (builder.lastType == (DataTypeSyntax *)0x0 && builder.lastNetType == (NetType *)0x0)
            {
              name_1 = (string_view)slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)pDVar34);
              SVar32 = parsing::Token::location((Token *)&name_1);
              type = Compilation::createEmptyTypeSyntax(pCVar20,SVar32);
              builder.lastType = &type->super_DataTypeSyntax;
              AVar27 = builder.lastDirection;
            }
          }
          __begin5.index = sVar24;
          __begin5.list = pPVar23;
          attrs._M_extent._M_extent_value = _Var59._M_extent_value;
          attrs._M_ptr = (pointer)pPVar57;
          pSVar31 = anon_unknown_0::AnsiPortListBuilder::add
                              (&builder,pDVar34,AVar27,&type->super_DataTypeSyntax,pNVar30,attrs);
        }
LAB_0068e531:
        name_3._M_len = (size_t)pSVar31;
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)scope,(Symbol **)&name_3);
      }
      else {
        pSVar38 = &pMVar29[1].attributes.super_SyntaxListBase.super_SyntaxNode;
        name_3 = parsing::Token::valueText((Token *)pSVar38);
        SVar32 = parsing::Token::location((Token *)pSVar38);
        name_1._M_len = (size_t)SVar32;
        __begin5.list = (ParentList *)CONCAT71(__begin5.list._1_7_,1);
        this_01 = BumpAllocator::
                  emplace<slang::ast::PortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,bool>
                            (&pCVar20->super_BumpAllocator,&name_3,(SourceLocation *)&name_1,
                             (bool *)&__begin5);
        AVar27 = builder.lastDirection;
        if (pMVar29[1].super_SyntaxNode.parent != (SyntaxNode *)0x0) {
          AVar27 = SemanticFacts::getDirection((TokenKind)pMVar29[1].super_SyntaxNode.kind);
        }
        this_01->direction = AVar27;
        (this_01->super_Symbol).originatingSyntax = &pMVar29->super_SyntaxNode;
        syntax_00._M_ptr =
             (pMVar29->attributes).
             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
        syntax_00._M_extent._M_extent_value =
             (pMVar29->attributes).
             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
             _M_extent_value;
        Symbol::setAttributes(&this_01->super_Symbol,builder.scope,syntax_00);
        if (pMVar29[1].attributes.
            super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr ==
            (pointer)0x0) {
          this_01->isNullPort = true;
        }
        builder.lastDirection = this_01->direction;
        builder.lastInterface = (DefinitionSymbol *)0x0;
        builder.lastModport._M_len._0_1_ = 0;
        builder.lastModport._M_len._1_7_ = 0;
        builder.lastType = (DataTypeSyntax *)0x0;
        builder.lastNetType = (NetType *)0x0;
        builder.lastModport._M_str = "";
        builder.lastGenericIface = false;
        name_3._M_len = (size_t)this_01;
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)scope,(Symbol **)&name_3);
      }
    }
    if (in_R9 != (PortInfo *)0x0) {
      name_3 = (string_view)
               slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)implicitMembers->data_);
      SVar32 = parsing::Token::location((Token *)&name_3);
      Scope::addDiag((Scope *)syntax,(DiagCode)0x9f0006,SVar32);
    }
  }
  else {
    builder.comp = *(Compilation **)&syntax->super_SyntaxNode;
    local_70.
    super_empty_value<slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>,_2U,_false>
    .value_.storage =
         (StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>
          )&builder.lastType;
    local_70.arrays.groups_size_index = 0x3f;
    local_70.arrays.groups_size_mask = 1;
    local_70.arrays.elements_ = (value_type_pointer)0x0;
    local_70.arrays.groups_ =
         (group_type_pointer)
         boost::unordered::detail::foa::
         dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
         ::storage;
    args_2 = in_R9;
    local_70.size_ctrl.ml =
         boost::unordered::detail::foa::
         table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
         ::initial_max_load(&local_70);
    local_70.size_ctrl.size = 0;
    pcVar39 = implicitMembers->firstElement;
    for (; implicitMembers !=
           (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)
           (pcVar39 + (long)in_R9 * 0x10 + -0x18);
        implicitMembers =
             (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)
             &implicitMembers->cap) {
      ppVar7 = implicitMembers->data_;
      pSVar31 = (Symbol *)implicitMembers->len;
      if (*(int *)&ppVar7->first == 0x16f) {
        __begin5.index = 0;
        pSVar8 = ppVar7[8].second;
        __begin5.list = (ParentList *)&ppVar7[5].second;
        for (; (__begin5.list != (ParentList *)&ppVar7[5].second ||
               (__begin5.index != (ulong)((long)&pSVar8->kind + 1U) >> 1));
            __begin5.index = __begin5.index + 1) {
          pDVar34 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
                    iterator_base<const_slang::syntax::DeclaratorSyntax_*>::dereference(&__begin5);
          __begin3.list = *(ParentList **)&pDVar34->name;
          __begin3.index = (size_t)(pDVar34->name).info;
          if (((ulong)__begin3.list & 0x10000) == 0) {
            _declLoc = parsing::Token::valueText((Token *)&__begin3);
            pDVar45 = (DefinitionSymbol *)ppVar7[4].second;
            name_3._M_str = (char *)ppVar7[4].first;
            name_3._M_len = (size_t)pDVar34;
            uVar35 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                               ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *
                                )&local_70,
                                (basic_string_view<char,_std::char_traits<char>_> *)&declLoc);
            uVar49 = uVar35 >> ((byte)local_70.arrays.groups_size_index & 0x3f);
            lVar46 = (uVar35 & 0xff) * 4;
            uVar13 = (&UNK_007e24cc)[lVar46];
            uVar14 = (&UNK_007e24cd)[lVar46];
            uVar15 = (&UNK_007e24ce)[lVar46];
            bVar16 = (&UNK_007e24cf)[lVar46];
            uVar44 = 0;
            uVar47 = uVar49;
            do {
              ppVar50 = local_70.arrays.elements_;
              pgVar22 = local_70.arrays.groups_;
              pgVar40 = local_70.arrays.groups_ + uVar47;
              bVar26 = pgVar40->m[0xf].n;
              auVar51[0] = -(pgVar40->m[0].n == uVar13);
              auVar51[1] = -(pgVar40->m[1].n == uVar14);
              auVar51[2] = -(pgVar40->m[2].n == uVar15);
              auVar51[3] = -(pgVar40->m[3].n == bVar16);
              auVar51[4] = -(pgVar40->m[4].n == uVar13);
              auVar51[5] = -(pgVar40->m[5].n == uVar14);
              auVar51[6] = -(pgVar40->m[6].n == uVar15);
              auVar51[7] = -(pgVar40->m[7].n == bVar16);
              auVar51[8] = -(pgVar40->m[8].n == uVar13);
              auVar51[9] = -(pgVar40->m[9].n == uVar14);
              auVar51[10] = -(pgVar40->m[10].n == uVar15);
              auVar51[0xb] = -(pgVar40->m[0xb].n == bVar16);
              auVar51[0xc] = -(pgVar40->m[0xc].n == uVar13);
              auVar51[0xd] = -(pgVar40->m[0xd].n == uVar14);
              auVar51[0xe] = -(pgVar40->m[0xe].n == uVar15);
              auVar51[0xf] = -(bVar26 == bVar16);
              uVar28 = (uint)(ushort)((ushort)(SUB161(auVar51 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe);
              if (uVar28 != 0) {
                do {
                  uVar12 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                    }
                  }
                  bVar25 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                           operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                       *)&local_70,
                                      (basic_string_view<char,_std::char_traits<char>_> *)&declLoc,
                                      &ppVar50[uVar47 * 0xf + (ulong)uVar12].first);
                  if (bVar25) {
                    SVar32 = parsing::Token::location((Token *)&__begin3);
                    pDVar33 = Scope::addDiag((Scope *)syntax,(DiagCode)0x2a000a,SVar32);
                    sVar54 = parsing::Token::valueText((Token *)&__begin3);
                    Diagnostic::operator<<(pDVar33,sVar54);
                    SVar32 = parsing::Token::location
                                       (&(ppVar50[uVar47 * 0xf + (ulong)uVar12].second.syntax.ptr)->
                                         name);
                    Diagnostic::addNote(pDVar33,(DiagCode)0xa0001,SVar32);
                    goto LAB_0068ed14;
                  }
                  uVar28 = uVar28 - 1 & uVar28;
                } while (uVar28 != 0);
                bVar26 = pgVar22[uVar47].m[0xf].n;
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[(uint)uVar35 & 7] & bVar26) == 0)
              break;
              lVar46 = uVar47 + uVar44;
              uVar44 = uVar44 + 1;
              uVar47 = lVar46 + 1U & local_70.arrays.groups_size_mask;
            } while (uVar44 <= local_70.arrays.groups_size_mask);
            if (local_70.size_ctrl.size < local_70.size_ctrl.ml) {
              args = &declLoc;
              args_2 = (PortInfo *)&name_3;
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,704ul,16ul>>
              ::
              unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                        ((locator *)&name_1,&local_70,uVar49,uVar35,(try_emplace_args_t *)args,
                         (basic_string_view<char,_std::char_traits<char>_> *)args_2,
                         in_stack_fffffffffffffb58);
              bVar48.m_bits = (underlying_type)args;
            }
            else {
              args_1 = &name_3;
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,704ul,16ul>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                        ((locator *)&name_1,&local_70,uVar35,(try_emplace_args_t *)&declLoc,args_1,
                         args_2);
              bVar48.m_bits = (underlying_type)args_1;
            }
            (local_458->second).insertionPoint = pSVar31;
            pSVar9 = ppVar7[5].first;
            pDVar34 = (local_458->second).syntax.ptr;
            sVar54 = parsing::Token::valueText(&pDVar34->name);
            name_1 = sVar54;
            SVar32 = parsing::Token::location(&pDVar34->name);
            declLoc = SVar32;
            SVar3 = (((PortHeaderSyntax *)&pSVar9->kind)->super_SyntaxNode).kind;
            if (SVar3 == InterfacePortHeader) {
              anon_unknown_0::getInterfacePortInfo
                        ((tuple<const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
                          *)&name_3,builder.scope,(InterfacePortHeaderSyntax *)pSVar9);
              pSVar21 = builder.scope;
              (local_458->second).isIface = true;
              (local_458->second).ifaceDef = pDVar45;
              (local_458->second).modport._M_len = name_3._M_len;
              (local_458->second).modport._M_str = name_3._M_str;
              if (pDVar34->initializer != (EqualsValueClauseSyntax *)0x0) {
                SVar55 = slang::syntax::SyntaxNode::sourceRange
                                   (&pDVar34->initializer->super_SyntaxNode);
                Scope::addDiag(pSVar21,(DiagCode)0x2f0006,SVar55);
              }
            }
            else if (SVar3 == NetPortHeader) {
              AVar27 = SemanticFacts::getDirection(((Token *)&pSVar9->location)->kind);
              pCVar20 = builder.comp;
              (local_458->second).direction = AVar27;
              pNVar30 = Compilation::getNetType(builder.comp,*(TokenKind *)&pSVar9->nextInScope);
              pNVar36 = BumpAllocator::
                        emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::NetType_const&>
                                  (&pCVar20->super_BumpAllocator,&name_1,&declLoc,pNVar30);
              pSVar38 = pSVar9->originatingSyntax;
LAB_0068ea6b:
              anon_unknown_0::NonAnsiPortListBuilder::setInternalSymbol
                        ((NonAnsiPortListBuilder *)&builder,&pNVar36->super_ValueSymbol,pDVar34,
                         (DataTypeSyntax *)pSVar38,&local_458->second);
            }
            else {
              AVar27 = SemanticFacts::getDirection(*(TokenKind *)&pSVar9->nextInScope);
              pSVar21 = builder.scope;
              (local_458->second).direction = AVar27;
              if (pSVar9->parentScope != (Scope *)0x0) {
                SVar55 = parsing::Token::range((Token *)&pSVar9->location);
                Scope::addDiag(pSVar21,(DiagCode)0x1e0006,SVar55);
              }
              if (*(SyntaxNode **)(pSVar9 + 1) == (SyntaxNode *)0x0) {
                pDVar42 = (DataTypeSyntax *)pSVar9[1].name._M_len;
                if ((pDVar42->super_ExpressionSyntax).super_SyntaxNode.kind != ImplicitType) {
                  sVar56 = slang::syntax::SyntaxFacts::getSimpleTypeName(pDVar42);
                  sVar54._M_len = sVar56._M_str;
                  sVar54._M_str = (char *)0x1;
                  pNVar30 = (NetType *)
                            Lookup::unqualified((Lookup *)builder.scope,(Scope *)sVar56._M_len,
                                                sVar54,bVar48);
                  if ((pNVar30 != (NetType *)0x0) && ((pNVar30->super_Symbol).kind == NetType)) {
                    pNVar36 = BumpAllocator::
                              emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::NetType_const&>
                                        (&(builder.comp)->super_BumpAllocator,&name_1,&declLoc,
                                         pNVar30);
                    pSVar38 = (SyntaxNode *)0x0;
                    goto LAB_0068ea6b;
                  }
                  goto LAB_0068eba4;
                }
                pSVar37 = Scope::find(builder.scope,sVar54);
                pCVar20 = builder.comp;
                if ((pSVar37 == (Symbol *)0x0) || (1 < pSVar37->kind - Net)) {
                  pNVar30 = anon_unknown_0::getDefaultNetType(builder.scope,SVar32);
                  pNVar36 = BumpAllocator::
                            emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::NetType_const&>
                                      (&pCVar20->super_BumpAllocator,&name_1,&declLoc,pNVar30);
                  goto LAB_0068ebd2;
                }
                (local_458->second).internalSymbol = pSVar37;
                pSVar10 = (local_458->second).insertionPoint;
                SVar41 = 1;
                if (pSVar10 != (Symbol *)0x0) {
                  SVar41 = pSVar10->indexInScope + 1;
                }
                if (SVar41 < pSVar37->indexInScope) {
                  *(SymbolIndex *)((long)&pSVar37[1].originatingSyntax + 4) =
                       *(SymbolIndex *)((long)&pSVar37[1].originatingSyntax + 4) & 0xc0000000 |
                       pSVar37->indexInScope & 0x3fffffff;
                  pSVar37->indexInScope = SVar41;
                }
                unpackedDimensions._M_ptr =
                     (pDVar34->dimensions).
                     super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
                     _M_ptr;
                unpackedDimensions._M_extent._M_extent_value =
                     (pDVar34->dimensions).
                     super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
                     _M_extent._M_extent_value;
                DeclaredType::mergeImplicitPort
                          ((DeclaredType *)(pSVar37 + 1),(ImplicitTypeSyntax *)pSVar9[1].name._M_len
                           ,SVar32,unpackedDimensions);
              }
              else {
LAB_0068eba4:
                name_3._M_len._0_4_ = 1;
                pNVar36 = (NetSymbol *)
                          BumpAllocator::
                          emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::VariableLifetime>
                                    (&(builder.comp)->super_BumpAllocator,&name_1,&declLoc,
                                     (VariableLifetime *)&name_3);
LAB_0068ebd2:
                anon_unknown_0::NonAnsiPortListBuilder::setInternalSymbol
                          ((NonAnsiPortListBuilder *)&builder,&pNVar36->super_ValueSymbol,pDVar34,
                           (DataTypeSyntax *)pSVar9[1].name._M_len,&local_458->second);
              }
              if (((local_458->second).direction == InOut) &&
                 (((local_458->second).internalSymbol)->kind != Net)) {
                pDVar33 = Scope::addDiag(builder.scope,(DiagCode)0x490006,declLoc);
                Diagnostic::operator<<(pDVar33,name_1);
              }
            }
            pSVar9 = (local_458->second).internalSymbol;
            if (pSVar9 == (Symbol *)0x0) {
              AVar27 = (local_458->second).direction;
              bVar25 = false;
LAB_0068ecd2:
              if (!(bool)(AVar27 != Out | bVar25)) goto LAB_0068ed14;
            }
            else {
              SVar4 = pSVar9->kind;
              bVar25 = SVar4 == Net;
              AVar27 = (local_458->second).direction;
              if (AVar27 == Ref && bVar25) {
                pDVar33 = Scope::addDiag(builder.scope,(DiagCode)0xbc0006,declLoc);
                Diagnostic::operator<<(pDVar33,name_1);
                AVar27 = (local_458->second).direction;
              }
              if (AVar27 != InOut || SVar4 != Net) goto LAB_0068ecd2;
              if (*(int *)((local_458->second).internalSymbol[5].name._M_str + 0x80) == 0xc) {
                pDVar33 = Scope::addDiag(builder.scope,(DiagCode)0x4a0006,declLoc);
                Diagnostic::operator<<(pDVar33,name_1);
              }
            }
            pSVar21 = builder.scope;
            if (pDVar34->initializer != (EqualsValueClauseSyntax *)0x0) {
              SVar55 = slang::syntax::SyntaxNode::sourceRange
                                 (&pDVar34->initializer->super_SyntaxNode);
              Scope::addDiag(pSVar21,(DiagCode)0x2f0006,SVar55);
            }
          }
LAB_0068ed14:
        }
      }
      else {
        sVar54 = parsing::Token::valueText((Token *)((long)(ppVar7[8].second)->location + 0x18));
        Compilation::tryGetDefinition
                  ((DefinitionLookupResult *)&name_3,builder.comp,sVar54,(Scope *)syntax);
        sVar19 = name_3._M_len;
        __begin5.index = 0;
        pSVar8 = ppVar7[0xc].first;
        __begin5.list = (ParentList *)(ppVar7 + 9);
        for (; (__begin5.list != (ParentList *)(ppVar7 + 9) ||
               (__begin5.index != (ulong)((long)&pSVar8->kind + 1U) >> 1));
            __begin5.index = __begin5.index + 1) {
          pDVar34 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
                    iterator_base<const_slang::syntax::DeclaratorSyntax_*>::dereference(&__begin5);
          __begin3.list = *(ParentList **)&pDVar34->name;
          __begin3.index = (size_t)(pDVar34->name).info;
          if (((ulong)__begin3.list & 0x10000) == 0) {
            _declLoc = parsing::Token::valueText((Token *)&__begin3);
            name_3._M_str = (char *)ppVar7[4].first;
            name_3._M_len = (size_t)pDVar34;
            uVar35 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                               ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *
                                )&local_70,
                                (basic_string_view<char,_std::char_traits<char>_> *)&declLoc);
            uVar49 = uVar35 >> ((byte)local_70.arrays.groups_size_index & 0x3f);
            lVar46 = (uVar35 & 0xff) * 4;
            uVar13 = (&UNK_007e24cc)[lVar46];
            uVar14 = (&UNK_007e24cd)[lVar46];
            uVar15 = (&UNK_007e24ce)[lVar46];
            bVar16 = (&UNK_007e24cf)[lVar46];
            uVar44 = 0;
            uVar47 = uVar49;
            do {
              ppVar50 = local_70.arrays.elements_;
              pgVar22 = local_70.arrays.groups_;
              pgVar40 = local_70.arrays.groups_ + uVar47;
              bVar26 = pgVar40->m[0xf].n;
              auVar52[0] = -(pgVar40->m[0].n == uVar13);
              auVar52[1] = -(pgVar40->m[1].n == uVar14);
              auVar52[2] = -(pgVar40->m[2].n == uVar15);
              auVar52[3] = -(pgVar40->m[3].n == bVar16);
              auVar52[4] = -(pgVar40->m[4].n == uVar13);
              auVar52[5] = -(pgVar40->m[5].n == uVar14);
              auVar52[6] = -(pgVar40->m[6].n == uVar15);
              auVar52[7] = -(pgVar40->m[7].n == bVar16);
              auVar52[8] = -(pgVar40->m[8].n == uVar13);
              auVar52[9] = -(pgVar40->m[9].n == uVar14);
              auVar52[10] = -(pgVar40->m[10].n == uVar15);
              auVar52[0xb] = -(pgVar40->m[0xb].n == bVar16);
              auVar52[0xc] = -(pgVar40->m[0xc].n == uVar13);
              auVar52[0xd] = -(pgVar40->m[0xd].n == uVar14);
              auVar52[0xe] = -(pgVar40->m[0xe].n == uVar15);
              auVar52[0xf] = -(bVar26 == bVar16);
              uVar28 = (uint)(ushort)((ushort)(SUB161(auVar52 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe);
              if (uVar28 != 0) {
                do {
                  uVar12 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                    }
                  }
                  bVar25 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                           operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                       *)&local_70,
                                      (basic_string_view<char,_std::char_traits<char>_> *)&declLoc,
                                      &ppVar50[uVar47 * 0xf + (ulong)uVar12].first);
                  if (bVar25) {
                    SVar32 = parsing::Token::location((Token *)&__begin3);
                    pDVar33 = Scope::addDiag((Scope *)syntax,(DiagCode)0x2a000a,SVar32);
                    sVar54 = parsing::Token::valueText((Token *)&__begin3);
                    Diagnostic::operator<<(pDVar33,sVar54);
                    SVar32 = parsing::Token::location
                                       (&(ppVar50[uVar47 * 0xf + (ulong)uVar12].second.syntax.ptr)->
                                         name);
                    Diagnostic::addNote(pDVar33,(DiagCode)0xa0001,SVar32);
                    goto LAB_0068f192;
                  }
                  uVar28 = uVar28 - 1 & uVar28;
                } while (uVar28 != 0);
                bVar26 = pgVar22[uVar47].m[0xf].n;
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[(uint)uVar35 & 7] & bVar26) == 0)
              break;
              lVar46 = uVar47 + uVar44;
              uVar44 = uVar44 + 1;
              uVar47 = lVar46 + 1U & local_70.arrays.groups_size_mask;
            } while (uVar44 <= local_70.arrays.groups_size_mask);
            if (local_70.size_ctrl.size < local_70.size_ctrl.ml) {
              args_2 = (PortInfo *)&name_3;
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,704ul,16ul>>
              ::
              unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                        ((locator *)&name_1,&local_70,uVar49,uVar35,(try_emplace_args_t *)&declLoc,
                         (basic_string_view<char,_std::char_traits<char>_> *)args_2,
                         in_stack_fffffffffffffb58);
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,704ul,16ul>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                        ((locator *)&name_1,&local_70,uVar35,(try_emplace_args_t *)&declLoc,&name_3,
                         args_2);
            }
            (local_458->second).isIface = true;
            (local_458->second).ifaceDef = (DefinitionSymbol *)sVar19;
            (local_458->second).insertionPoint = pSVar31;
            if (pDVar34->initializer != (EqualsValueClauseSyntax *)0x0) {
              SVar55 = slang::syntax::SyntaxNode::sourceRange
                                 (&pDVar34->initializer->super_SyntaxNode);
              Scope::addDiag((Scope *)syntax,(DiagCode)0x2f0006,SVar55);
            }
          }
LAB_0068f192:
        }
      }
    }
    ppSVar1 = &(this->super_Symbol).nextInScope;
    name_1._M_str = (char *)0x0;
    name_1._M_len = (size_t)ppSVar1;
    pTVar5 = this->type;
    pcVar39 = (char *)0x0;
    ppSVar43 = ppSVar1;
    while ((ppSVar43 != ppSVar1 ||
           (pcVar39 != (char *)((ulong)((long)&(pTVar5->super_Symbol).kind + 1U) >> 1)))) {
      pSVar38 = &slang::syntax::SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax>::
                 iterator_base<const_slang::syntax::NonAnsiPortSyntax_*>::dereference
                           ((iterator_base<const_slang::syntax::NonAnsiPortSyntax_*> *)&name_1)->
                 super_SyntaxNode;
      pCVar20 = builder.comp;
      SVar3 = ((SyntaxNode *)&pSVar38->kind)->kind;
      if (SVar3 == EmptyNonAnsiPort) {
        SVar32 = parsing::Token::location((Token *)(pSVar38 + 1));
        name_3._M_len = (size_t)SVar32;
        __begin3.list = (ParentList *)((ulong)__begin3.list & 0xffffffffffffff00);
        __begin5.list =
             (ParentList *)
             BumpAllocator::
             emplace<slang::ast::PortSymbol,char_const(&)[1],slang::SourceLocation,bool>
                       (&pCVar20->super_BumpAllocator,(char (*) [1])0x88e35c,
                        (SourceLocation *)&name_3,(bool *)&__begin3);
        ((PortSymbol *)__begin5.list)->direction = In;
        (((PortSymbol *)__begin5.list)->super_Symbol).originatingSyntax = pSVar38;
        ((PortSymbol *)__begin5.list)->isNullPort = true;
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)scope,(Symbol **)&__begin5);
      }
      else if (SVar3 == ExplicitNonAnsiPort) {
        sVar54 = parsing::Token::valueText((Token *)&pSVar38[1].previewNode);
        name_3 = sVar54;
        __begin5.list = (ParentList *)parsing::Token::location((Token *)&pSVar38[1].previewNode);
        pPVar11 = *(PortConcatenationSyntax **)(pSVar38 + 3);
        if (pPVar11 == (PortConcatenationSyntax *)0x0) {
          auVar17[0xf] = 0;
          auVar17._0_15_ = stack0xfffffffffffffb89;
          _declLoc = (string_view)(auVar17 << 8);
          __begin3.list =
               (ParentList *)
               BumpAllocator::
               emplace<slang::ast::PortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,bool>
                         (&(builder.comp)->super_BumpAllocator,&name_3,(SourceLocation *)&__begin5,
                          (bool *)&declLoc);
          ((PortSymbol *)__begin3.list)->direction = In;
          (((PortSymbol *)__begin3.list)->super_Symbol).originatingSyntax = pSVar38;
          ((PortSymbol *)__begin3.list)->isNullPort = true;
        }
        else if ((pPVar11->super_PortExpressionSyntax).super_SyntaxNode.kind == PortReference) {
          __begin3.list =
               (ParentList *)
               anon_unknown_0::NonAnsiPortListBuilder::createPort
                         ((NonAnsiPortListBuilder *)&builder,sVar54,(SourceLocation)__begin5.list,
                          (PortReferenceSyntax *)pPVar11);
        }
        else {
          __begin3.list =
               (ParentList *)
               anon_unknown_0::NonAnsiPortListBuilder::createPort
                         ((NonAnsiPortListBuilder *)&builder,sVar54,(SourceLocation)__begin5.list,
                          pPVar11);
        }
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)scope,(Symbol **)&__begin3);
      }
      else {
        name_3 = (string_view)
                 slang::syntax::SyntaxNode::getFirstToken(*(SyntaxNode **)(pSVar38 + 1));
        SVar32 = parsing::Token::location((Token *)&name_3);
        pPVar11 = *(PortConcatenationSyntax **)(pSVar38 + 1);
        if ((pPVar11->super_PortExpressionSyntax).super_SyntaxNode.kind == PortReference) {
          __begin5.list =
               (ParentList *)
               anon_unknown_0::NonAnsiPortListBuilder::createPort
                         ((NonAnsiPortListBuilder *)&builder,
                          (string_view)(ZEXT816(0x88e35c) << 0x40),SVar32,
                          (PortReferenceSyntax *)pPVar11);
        }
        else {
          __begin5.list =
               (ParentList *)
               anon_unknown_0::NonAnsiPortListBuilder::createPort
                         ((NonAnsiPortListBuilder *)&builder,
                          (string_view)(ZEXT816(0x88e35c) << 0x40),SVar32,pPVar11);
        }
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)scope,(Symbol **)&__begin5);
      }
      pcVar39 = name_1._M_str + 1;
      name_1._M_str = pcVar39;
      ppSVar43 = (Symbol **)name_1._M_len;
    }
    name_3._M_str = (char *)local_70.arrays.elements_;
    name_3._M_len = (size_t)local_70.arrays.groups_;
    pgVar40 = local_70.arrays.groups_;
    if (local_70.arrays.elements_ == (value_type_pointer)0x0) {
      ppVar50 = (value_type_pointer)0x0;
    }
    else {
      auVar53[0] = -((local_70.arrays.groups_)->m[0].n == '\0');
      auVar53._1_7_ = 0;
      auVar53[8] = -((local_70.arrays.groups_)->m[8].n == '\0');
      auVar53[9] = -((local_70.arrays.groups_)->m[9].n == '\0');
      auVar53[10] = -((local_70.arrays.groups_)->m[10].n == '\0');
      auVar53[0xb] = -((local_70.arrays.groups_)->m[0xb].n == '\0');
      auVar53[0xc] = -((local_70.arrays.groups_)->m[0xc].n == '\0');
      auVar53[0xd] = -((local_70.arrays.groups_)->m[0xd].n == '\0');
      auVar53[0xe] = -((local_70.arrays.groups_)->m[0xe].n == '\0');
      auVar53[0xf] = -((local_70.arrays.groups_)->m[0xf].n == '\0');
      ppVar50 = local_70.arrays.elements_;
      if ((auVar53 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      *)&name_3);
        pgVar40 = (group_type_pointer)name_3._M_len;
        ppVar50 = (value_type_pointer)name_3._M_str;
      }
    }
    name_3._M_str = (char *)ppVar50;
    name_3._M_len = (size_t)pgVar40;
    while (pSVar21 = builder.scope, ppVar50 != (value_type_pointer)0x0) {
      if ((ppVar50->second).used == false) {
        SVar55 = slang::syntax::SyntaxNode::sourceRange
                           (&((ppVar50->second).syntax.ptr)->super_SyntaxNode);
        pDVar33 = Scope::addDiag(pSVar21,(DiagCode)0xd40006,SVar55);
        sVar56._M_len = (ppVar50->first)._M_len;
        sVar56._M_str = (ppVar50->first)._M_str;
        Diagnostic::operator<<(pDVar33,sVar56);
      }
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                    *)&name_3);
      ppVar50 = (value_type_pointer)name_3._M_str;
    }
    SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
    ::~SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
                 *)&builder.lastType);
  }
  return;
}

Assistant:

void PortSymbol::fromSyntax(
    const PortListSyntax& syntax, const Scope& scope, SmallVectorBase<const Symbol*>& results,
    SmallVectorBase<std::pair<Symbol*, const Symbol*>>& implicitMembers,
    std::span<std::pair<const SyntaxNode*, const Symbol*> const> portDeclarations) {

    switch (syntax.kind) {
        case SyntaxKind::AnsiPortList: {
            AnsiPortListBuilder builder{scope, implicitMembers};
            for (auto port : syntax.as<AnsiPortListSyntax>().ports) {
                switch (port->kind) {
                    case SyntaxKind::ImplicitAnsiPort:
                        results.push_back(builder.createPort(port->as<ImplicitAnsiPortSyntax>()));
                        break;
                    case SyntaxKind::ExplicitAnsiPort:
                        results.push_back(builder.createPort(port->as<ExplicitAnsiPortSyntax>()));
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }

            if (!portDeclarations.empty()) {
                scope.addDiag(diag::PortDeclInANSIModule,
                              portDeclarations[0].first->getFirstToken().location());
            }
            break;
        }
        case SyntaxKind::NonAnsiPortList: {
            NonAnsiPortListBuilder builder{scope, portDeclarations, implicitMembers};
            for (auto port : syntax.as<NonAnsiPortListSyntax>().ports) {
                switch (port->kind) {
                    case SyntaxKind::ImplicitNonAnsiPort:
                        results.push_back(
                            builder.createPort(port->as<ImplicitNonAnsiPortSyntax>()));
                        break;
                    case SyntaxKind::ExplicitNonAnsiPort:
                        results.push_back(
                            builder.createPort(port->as<ExplicitNonAnsiPortSyntax>()));
                        break;
                    case SyntaxKind::EmptyNonAnsiPort:
                        results.push_back(builder.createPort(port->as<EmptyNonAnsiPortSyntax>()));
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }
            builder.finalize();
            break;
        }
        default:
            SLANG_UNREACHABLE;
    }
}